

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nonlinearsolver.c
# Opt level: O3

SUNNonlinearSolver SUNNonlinSolNewEmpty(SUNContext sunctx)

{
  SUNNonlinearSolver __ptr;
  SUNNonlinearSolver_Ops p_Var1;
  
  if ((sunctx != (SUNContext)0x0) &&
     (__ptr = (SUNNonlinearSolver)malloc(0x18), __ptr != (SUNNonlinearSolver)0x0)) {
    p_Var1 = (SUNNonlinearSolver_Ops)calloc(1,0x68);
    if (p_Var1 != (SUNNonlinearSolver_Ops)0x0) {
      __ptr->sunctx = sunctx;
      __ptr->ops = p_Var1;
      __ptr->content = (void *)0x0;
      return __ptr;
    }
    free(__ptr);
  }
  return (SUNNonlinearSolver)0x0;
}

Assistant:

SUNNonlinearSolver SUNNonlinSolNewEmpty(SUNContext sunctx)
{
  SUNNonlinearSolver     NLS;
  SUNNonlinearSolver_Ops ops;

  /* check input */
  if (!sunctx) return(NULL);

  /* create nonlinear solver object */
  NLS = NULL;
  NLS = (SUNNonlinearSolver) malloc(sizeof *NLS);
  if (NLS == NULL) return(NULL);

  /* create nonlinear solver ops structure */
  ops = NULL;
  ops = (SUNNonlinearSolver_Ops) malloc(sizeof *ops);
  if (ops == NULL) { free(NLS); return(NULL); }

  /* initialize operations to NULL */
  ops->gettype         = NULL;
  ops->initialize      = NULL;
  ops->setup           = NULL;
  ops->solve           = NULL;
  ops->free            = NULL;
  ops->setsysfn        = NULL;
  ops->setlsetupfn     = NULL;
  ops->setlsolvefn     = NULL;
  ops->setctestfn      = NULL;
  ops->setmaxiters     = NULL;
  ops->getnumiters     = NULL;
  ops->getcuriter      = NULL;
  ops->getnumconvfails = NULL;

  /* attach context and ops, initialize content to NULL */
  NLS->sunctx  = sunctx;
  NLS->ops     = ops;
  NLS->content = NULL;

  return(NLS);
}